

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
create_spatial_splits
          (HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,PrimInfoExtRange *set,SpatialSplit *split,SpatialBinMapping<16UL> *mapping)

{
  unsigned_long *puVar1;
  int iVar2;
  char cVar3;
  runtime_error *this_00;
  float fVar4;
  atomic<unsigned_long> ext_elements;
  size_t max_ext_range_size;
  size_t ext_range_start;
  float fpos;
  task_group_context context;
  auto_partitioner local_129;
  atomic<unsigned_long> local_128;
  __atomic_base<unsigned_long> local_120;
  unsigned_long local_118;
  float local_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  anon_class_8_1_898bcfc2 local_f0;
  blocked_range<unsigned_long> local_e8;
  task_group_context local_c8;
  anon_class_48_6_fef31792 local_48;
  
  local_118 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_120._M_i = (set->super_extended_range<unsigned_long>)._ext_end - local_118;
  LOCK();
  local_128.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  iVar2 = split->pos;
  if ((long)iVar2 < 0) {
    fVar4 = (float)(ulong)(long)iVar2;
  }
  else {
    fVar4 = (float)iVar2;
  }
  local_10c = fVar4 * (split->mapping).inv_scale.field_0.v[split->dim] +
              (split->mapping).ofs.field_0.v[split->dim];
  local_48.fpos = &local_10c;
  local_48.ext_elements = &local_128;
  local_48.max_ext_range_size = &local_120._M_i;
  local_48.ext_range_start = &local_118;
  local_c8.my_version = proxy_support;
  local_c8.my_traits = (context_traits)0x4;
  local_c8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_c8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_c8.my_name = CUSTOM_CTX;
  uStack_100 = (undefined4)
               (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uStack_104 = *(undefined4 *)
                ((long)&(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin
                + 4);
  local_108 = (undefined4)(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end
  ;
  uStack_fc = uStack_104;
  local_48.this = this;
  local_48.split = split;
  tbb::detail::r1::initialize(&local_c8);
  local_e8.my_end = CONCAT44(uStack_104,local_108);
  local_e8.my_begin = CONCAT44(uStack_fc,uStack_100);
  local_e8.my_grainsize = 0x40;
  local_f0.func = &local_48;
  tbb::detail::d1::
  start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_e8,&local_f0,&local_129,&local_c8);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c8);
  if (cVar3 == '\0') {
    tbb::detail::r1::destroy(&local_c8);
    if (local_120._M_i < (ulong)local_128.super___atomic_base<unsigned_long>._M_i) {
      local_128.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_120._M_i;
    }
    puVar1 = &(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
    *puVar1 = *puVar1 + (long)local_128.super___atomic_base<unsigned_long>._M_i;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void create_spatial_splits(PrimInfoExtRange& set, const SpatialSplit& split, const SpatialBinMapping<SPATIAL_BINS> &mapping)
        {
          assert(set.has_ext_range());
          const size_t max_ext_range_size = set.ext_range_size();
          const size_t ext_range_start = set.end();

          /* atomic counter for number of primref splits */
          std::atomic<size_t> ext_elements;
          ext_elements.store(0);
          
          const float fpos = split.mapping.pos(split.pos,split.dim);
        
          const unsigned int mask = 0xFFFFFFFF >> RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS;

          parallel_for( set.begin(), set.end(), CREATE_SPLITS_STEP_SIZE, [&](const range<size_t>& r) {
              for (size_t i=r.begin();i<r.end();i++)
              {
                const unsigned int splits = prims0[i].geomID() >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS);

                if (likely(splits <= 1)) continue; /* todo: does this ever happen ? */

                const int bin0 = split.mapping.bin(prims0[i].lower)[split.dim];
                const int bin1 = split.mapping.bin(prims0[i].upper)[split.dim];
                if (unlikely(bin0 < split.pos && bin1 >= split.pos))
                {
                  assert(splits > 1);

                  PrimRef left,right;
                  const auto splitter = splitterFactory(prims0[i]);
                  splitter(prims0[i],split.dim,fpos,left,right);
                
                  // no empty splits
                  if (unlikely(left.bounds().empty() || right.bounds().empty())) continue;
                
                  left.lower.u  = (left.lower.u  & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
                  right.lower.u = (right.lower.u & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));

                  const size_t ID = ext_elements.fetch_add(1);

                  /* break if the number of subdivided elements are greater than the maximum allowed size */
                  if (unlikely(ID >= max_ext_range_size)) 
                    break;

                  /* only write within the correct bounds */
                  assert(ID < max_ext_range_size);
                  prims0[i] = left;
                  prims0[ext_range_start+ID] = right;     
                }
              }
            });

          const size_t numExtElements = min(max_ext_range_size,ext_elements.load());          
          assert(set.end()+numExtElements<=set.ext_end());
          set._end += numExtElements;
        }